

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryFillExpr(BinaryReaderIR *this,Index memidx)

{
  Location local_98;
  Var local_78;
  undefined1 local_30 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28 [2];
  undefined8 uStack_18;
  Index memidx_local;
  BinaryReaderIR *this_local;
  
  local_28[1]._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl._4_4_ = memidx;
  uStack_18 = this;
  GetLocation(&local_98,this);
  Var::Var(&local_78,memidx,&local_98);
  std::make_unique<wabt::MemoryExpr<(wabt::ExprType)30>,wabt::Var>((Var *)local_30);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::MemoryExpr<(wabt::ExprType)30>,std::default_delete<wabt::MemoryExpr<(wabt::ExprType)30>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)local_28,
             (unique_ptr<wabt::MemoryExpr<(wabt::ExprType)30>,_std::default_delete<wabt::MemoryExpr<(wabt::ExprType)30>_>_>
              *)local_30);
  this_local._4_4_ = AppendExpr(this,local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(local_28);
  std::
  unique_ptr<wabt::MemoryExpr<(wabt::ExprType)30>,_std::default_delete<wabt::MemoryExpr<(wabt::ExprType)30>_>_>
  ::~unique_ptr((unique_ptr<wabt::MemoryExpr<(wabt::ExprType)30>,_std::default_delete<wabt::MemoryExpr<(wabt::ExprType)30>_>_>
                 *)local_30);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnMemoryFillExpr(Index memidx) {
  return AppendExpr(
      std::make_unique<MemoryFillExpr>(Var(memidx, GetLocation())));
}